

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBorderClampSamplingTexture.cpp
# Opt level: O1

bool __thiscall
glcts::TextureBorderClampSamplingTexture<unsigned_short,_unsigned_char>::checkLinear
          (TextureBorderClampSamplingTexture<unsigned_short,_unsigned_char> *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *buffer,GLint layer)

{
  ostringstream *poVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  pointer puVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  bool bVar19;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  uVar10 = (this->m_test_configuration).m_width;
  uVar7 = uVar10 >> 1;
  uVar6 = (this->m_test_configuration).m_height;
  uVar11 = uVar6 >> 1;
  uVar2 = (this->m_test_configuration).m_n_in_components;
  uVar8 = (ulong)uVar2;
  uVar3 = (this->m_test_configuration).m_n_out_components;
  uVar9 = (ulong)uVar3;
  iVar12 = uVar3 * uVar10;
  bVar19 = 2 < uVar6;
  if (bVar19) {
    uVar4 = uVar8;
    if (uVar3 < uVar2) {
      uVar4 = uVar9;
    }
    puVar5 = (buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar13 = (uVar10 * uVar11 + uVar7) * uVar3;
    uVar14 = ((uVar11 + 1) * uVar10 + uVar7) * uVar3;
    uVar15 = uVar4;
    uVar18 = uVar11;
    uVar17 = uVar14;
    uVar16 = uVar13;
    do {
      for (; uVar15 != 0; uVar15 = uVar15 - 1) {
        if (puVar5[uVar14] < puVar5[uVar13]) {
          local_1b0._0_8_ =
               ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          poVar1 = (ostringstream *)(local_1b0 + 8);
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"For layer (",0xb);
          std::ostream::operator<<(poVar1,layer);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,") when moving from center point  (x, y)  = (",0x2c);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,",",1);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,") to the bottom\n",0x10);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,"at point (x, y)  = (",0x14);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,",",1);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,") - texel values stopped to be monotonically increasing\n",
                     0x38);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar1);
          std::ios_base::~ios_base(local_138);
          if (bVar19) {
            return false;
          }
          goto LAB_00ce2518;
        }
        uVar13 = uVar13 + 1;
        uVar14 = uVar14 + 1;
      }
      uVar18 = uVar18 + 1;
      uVar13 = uVar16 + iVar12;
      uVar14 = uVar17 + iVar12;
      bVar19 = uVar18 < uVar11 + uVar6 / 3;
      uVar15 = uVar4;
      uVar17 = uVar14;
      uVar16 = uVar13;
    } while (bVar19);
  }
LAB_00ce2518:
  uVar6 = uVar11 - uVar6 / 3;
  if (uVar6 < uVar11) {
    uVar4 = uVar8;
    if (uVar3 < uVar2) {
      uVar4 = uVar9;
    }
    puVar5 = (buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar14 = (uVar10 * uVar11 + uVar7) * uVar3;
    uVar18 = ((uVar11 - 1) * uVar10 + uVar7) * uVar3;
    uVar13 = uVar11;
    do {
      uVar17 = uVar14;
      uVar16 = uVar18;
      for (uVar15 = uVar4; uVar15 != 0; uVar15 = uVar15 - 1) {
        if (puVar5[uVar16] < puVar5[uVar17]) {
          local_1b0._0_8_ =
               ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          poVar1 = (ostringstream *)(local_1b0 + 8);
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"For layer (",0xb);
          std::ostream::operator<<(poVar1,layer);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,") when moving from center point  (x, y)  = (",0x2c);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,",",1);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,") to the top\n",0xd)
          ;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,"at point (x, y)  = (",0x14);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,",",1);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,")- texel values stopped to be monotonically increasing\n",
                     0x37);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar1);
          std::ios_base::~ios_base(local_138);
          if (uVar6 < uVar13) {
            return false;
          }
          goto LAB_00ce26c2;
        }
        uVar17 = uVar17 + 1;
        uVar16 = uVar16 + 1;
      }
      uVar13 = uVar13 - 1;
      uVar14 = uVar14 - iVar12;
      uVar18 = uVar18 - iVar12;
    } while (uVar6 < uVar13);
  }
LAB_00ce26c2:
  bVar19 = 2 < uVar10;
  if (bVar19) {
    uVar4 = uVar8;
    if (uVar3 < uVar2) {
      uVar4 = uVar9;
    }
    puVar5 = (buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar13 = uVar3 * uVar7 + uVar11;
    uVar14 = (uVar7 + 1) * uVar3 + uVar11;
    uVar15 = uVar4;
    uVar6 = uVar7;
    uVar18 = uVar14;
    uVar17 = uVar13;
    do {
      for (; uVar15 != 0; uVar15 = uVar15 - 1) {
        if (puVar5[uVar14] < puVar5[uVar13]) {
          local_1b0._0_8_ =
               ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          poVar1 = (ostringstream *)(local_1b0 + 8);
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"For layer (",0xb);
          std::ostream::operator<<(poVar1,layer);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,") when moving from center point  (x, y) = (",0x2b);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,",",1);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,") to the right\n",0xf);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,"at point (x, y)  = (",0x14);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,",",1);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,")- texel values stopped to be monotonically increasing\n",
                     0x37);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar1);
          std::ios_base::~ios_base(local_138);
          if (bVar19) {
            return false;
          }
          goto LAB_00ce287f;
        }
        uVar13 = uVar13 + 1;
        uVar14 = uVar14 + 1;
      }
      uVar6 = uVar6 + 1;
      uVar13 = uVar17 + uVar3;
      uVar14 = uVar18 + uVar3;
      bVar19 = uVar6 < uVar7 + uVar10 / 3;
      uVar15 = uVar4;
      uVar18 = uVar14;
      uVar17 = uVar13;
    } while (bVar19);
  }
LAB_00ce287f:
  uVar7 = uVar7 - uVar10 / 3;
  bVar19 = uVar11 <= uVar7;
  if (uVar7 < uVar11) {
    if (uVar3 < uVar2) {
      uVar8 = uVar9;
    }
    puVar5 = (buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar10 = (uVar3 + 1) * uVar11;
    uVar9 = uVar8;
    uVar6 = uVar10;
    do {
      for (; uVar9 != 0; uVar9 = uVar9 - 1) {
        if (puVar5[uVar10 - uVar3] < puVar5[uVar10]) {
          local_1b0._0_8_ =
               ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          poVar1 = (ostringstream *)(local_1b0 + 8);
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"For layer (",0xb);
          std::ostream::operator<<(poVar1,layer);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,") when moving from center point  (x, y) = (",0x2b);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,",",1);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,") to the left\n",0xe);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,"at point (x, y)  = (",0x14);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,",",1);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,")- texel values stopped to be monotonically increasing\n",
                     0x37);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar1);
          std::ios_base::~ios_base(local_138);
          return bVar19;
        }
        uVar10 = uVar10 + 1;
      }
      uVar11 = uVar11 - 1;
      uVar10 = uVar6 - uVar3;
      bVar19 = uVar11 <= uVar7;
      uVar9 = uVar8;
      uVar6 = uVar10;
    } while (uVar7 < uVar11);
  }
  return bVar19;
}

Assistant:

bool TextureBorderClampSamplingTexture<InputType, OutputType>::checkLinear(std::vector<OutputType>& buffer,
																		   glw::GLint layer)
{
	glw::GLuint centerX = m_test_configuration.get_width() / 2;
	glw::GLuint centerY = m_test_configuration.get_height() / 2;
	glw::GLuint stepX   = m_test_configuration.get_width() / 3;
	glw::GLuint stepY   = m_test_configuration.get_height() / 3;

	glw::GLuint index = 0;

	glw::GLuint in_components  = m_test_configuration.get_n_in_components();
	glw::GLuint out_components = m_test_configuration.get_n_out_components();
	glw::GLuint outRowWidth	= m_test_configuration.get_width() * out_components;

	/* Check values from center to the bottom */
	for (glw::GLuint y = centerY; y < centerY + stepY; ++y)
	{
		for (glw::GLuint c = 0; c < deMinu32(out_components, in_components); ++c)
		{
			index = y * outRowWidth + centerX * out_components + c;
			if (buffer[index + outRowWidth] - buffer[index] < 0)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "For layer (" << layer
								   << ") when moving from center point  (x, y)  = (" << centerX << "," << centerY
								   << ") to the bottom\n"
								   << "at point (x, y)  = (" << centerX << "," << y
								   << ") - texel values stopped to be monotonically increasing\n"
								   << tcu::TestLog::EndMessage;
				return false;
			}
		}
	}

	/* Check values from center to the top */
	for (glw::GLuint y = centerY; y > centerY - stepY; --y)
	{
		for (glw::GLuint c = 0; c < deMinu32(out_components, in_components); ++c)
		{
			index = y * outRowWidth + centerX * out_components + c;
			if (buffer[index - outRowWidth] - buffer[index] < 0)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "For layer (" << layer
								   << ") when moving from center point  (x, y)  = (" << centerX << "," << centerY
								   << ") to the top\n"
								   << "at point (x, y)  = (" << centerX << "," << y
								   << ")- texel values stopped to be monotonically increasing\n"
								   << tcu::TestLog::EndMessage;
				return false;
			}
		}
	}

	/* Check values from center to the right */
	for (glw::GLuint x = centerX; x < centerX + stepX; ++x)
	{
		for (glw::GLuint c = 0; c < deMinu32(out_components, in_components); ++c)
		{
			index = centerY + x * out_components + c;
			if (buffer[index + out_components] - buffer[index] < 0)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "For layer (" << layer
								   << ") when moving from center point  (x, y) = (" << centerX << "," << centerY
								   << ") to the right\n"
								   << "at point (x, y)  = (" << x << "," << centerY
								   << ")- texel values stopped to be monotonically increasing\n"
								   << tcu::TestLog::EndMessage;
				return false;
			}
		}
	}

	/* Check values from center to the left */
	for (glw::GLuint x = centerY; x > centerX - stepX; --x)
	{
		for (glw::GLuint c = 0; c < deMinu32(out_components, in_components); ++c)
		{
			index = centerY + x * out_components + c;
			if (buffer[index - out_components] - buffer[index] < 0)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "For layer (" << layer
								   << ") when moving from center point  (x, y) = (" << centerX << "," << centerY
								   << ") to the left\n"
								   << "at point (x, y)  = (" << x << "," << centerY
								   << ")- texel values stopped to be monotonically increasing\n"
								   << tcu::TestLog::EndMessage;
				return false;
			}
		}
	}

	return true;
}